

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
write(arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<wchar_t> s;
  string *msg;
  size_t count;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  basic_string_view<wchar_t> sv;
  size_t length;
  allocator *this_00;
  format_specs *in_stack_ffffffffffffff88;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffa0;
  wchar_t *local_58;
  allocator local_31;
  string local_30 [32];
  wchar_t *local_10;
  arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
  *local_8;
  
  local_10 = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if (local_10 == (wchar_t *)0x0) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"string pointer is null",this_00);
    duckdb::InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&duckdb::InternalException::typeinfo,
                duckdb::InternalException::~InternalException);
  }
  count = std::char_traits<wchar_t>::length((char_type_conflict *)0x25cd5a4);
  basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)&stack0xffffffffffffffa0,local_10,count);
  if (this->specs_ == (format_specs *)0x0) {
    sVar1 = basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write
                      (&this->writer_,(int)in_stack_ffffffffffffffa0,local_58,__n);
  }
  else {
    s.size_ = (size_t)in_stack_ffffffffffffffa0;
    s.data_ = local_58;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write<wchar_t>
              (in_stack_ffffffffffffffa0,s,in_stack_ffffffffffffff88);
    sVar1 = extraout_RAX;
  }
  return sVar1;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(duckdb::InternalException("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }